

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

void Fl_Shared_Image::add_handler(Fl_Shared_Handler f)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Fl_Shared_Handler *__dest;
  Fl_Shared_Handler *temp;
  int i;
  Fl_Shared_Handler f_local;
  
  temp._4_4_ = 0;
  while( true ) {
    if (num_handlers_ <= temp._4_4_) {
      if (alloc_handlers_ <= num_handlers_) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(alloc_handlers_ + 0x20);
        uVar2 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        __dest = (Fl_Shared_Handler *)operator_new__(uVar2);
        if ((alloc_handlers_ != 0) &&
           (memcpy(__dest,handlers_,(long)alloc_handlers_ << 3),
           handlers_ != (Fl_Shared_Handler *)0x0)) {
          operator_delete__(handlers_);
        }
        alloc_handlers_ = alloc_handlers_ + 0x20;
        handlers_ = __dest;
      }
      handlers_[num_handlers_] = f;
      num_handlers_ = num_handlers_ + 1;
      return;
    }
    if (handlers_[temp._4_4_] == f) break;
    temp._4_4_ = temp._4_4_ + 1;
  }
  return;
}

Assistant:

void Fl_Shared_Image::add_handler(Fl_Shared_Handler f) {
  int			i;		// Looping var...
  Fl_Shared_Handler	*temp;		// New image handler array...

  // First see if we have already added the handler...
  for (i = 0; i < num_handlers_; i ++) {
    if (handlers_[i] == f) return;
  }

  if (num_handlers_ >= alloc_handlers_) {
    // Allocate more memory...
    temp = new Fl_Shared_Handler [alloc_handlers_ + 32];

    if (alloc_handlers_) {
      memcpy(temp, handlers_, alloc_handlers_ * sizeof(Fl_Shared_Handler));

      delete[] handlers_;
    }

    handlers_       = temp;
    alloc_handlers_ += 32;
  }

  handlers_[num_handlers_] = f;
  num_handlers_ ++;
}